

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha512.c
# Opt level: O2

void rhash_sha512_process_block(uint64_t *hash,uint64_t *block)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  ulong uVar20;
  ulong local_170;
  ulong local_168;
  ulong local_160;
  ulong local_158;
  ulong local_140;
  ulong local_138;
  ulong local_130;
  ulong local_128;
  ulong local_120;
  ulong local_118;
  ulong local_110;
  ulong local_108;
  ulong local_100;
  ulong local_e8;
  
  uVar1 = *hash;
  uVar2 = hash[1];
  uVar3 = hash[2];
  uVar4 = hash[4];
  uVar5 = hash[5];
  uVar6 = hash[6];
  uVar15 = *block;
  local_138 = uVar15 >> 0x38 | (uVar15 & 0xff000000000000) >> 0x28 |
              (uVar15 & 0xff0000000000) >> 0x18 | (uVar15 & 0xff00000000) >> 8 |
              (uVar15 & 0xff000000) << 8 | (uVar15 & 0xff0000) << 0x18 | (uVar15 & 0xff00) << 0x28 |
              uVar15 << 0x38;
  lVar9 = local_138 + 0x428a2f98d728ae22 +
          ((uVar6 ^ uVar5) & uVar4 ^ uVar6) + hash[7] +
          ((uVar4 << 0x17 | uVar4 >> 0x29) ^
          (uVar4 << 0x2e | uVar4 >> 0x12) ^ (uVar4 << 0x32 | uVar4 >> 0xe));
  uVar13 = ((uVar2 ^ uVar1) & uVar3 ^ uVar2 & uVar1) +
           ((uVar1 << 0x19 | uVar1 >> 0x27) ^
           (uVar1 << 0x1e | uVar1 >> 0x22) ^ (uVar1 << 0x24 | uVar1 >> 0x1c)) + lVar9;
  uVar10 = lVar9 + hash[3];
  uVar15 = block[1];
  local_108 = uVar15 >> 0x38 | (uVar15 & 0xff000000000000) >> 0x28 |
              (uVar15 & 0xff0000000000) >> 0x18 | (uVar15 & 0xff00000000) >> 8 |
              (uVar15 & 0xff000000) << 8 | (uVar15 & 0xff0000) << 0x18 | (uVar15 & 0xff00) << 0x28 |
              uVar15 << 0x38;
  lVar9 = ((uVar5 ^ uVar4) & uVar10 ^ uVar5) + local_108 + uVar6 + 0x7137449123ef65cd +
          ((uVar10 * 0x800000 | uVar10 >> 0x29) ^
          (uVar10 << 0x2e | uVar10 >> 0x12) ^ (uVar10 << 0x32 | uVar10 >> 0xe));
  uVar14 = ((uVar13 ^ uVar1) & uVar2 ^ uVar13 & uVar1) +
           ((uVar13 * 0x2000000 | uVar13 >> 0x27) ^
           (uVar13 * 0x40000000 | uVar13 >> 0x22) ^ (uVar13 << 0x24 | uVar13 >> 0x1c)) + lVar9;
  uVar11 = lVar9 + uVar3;
  uVar15 = block[2];
  local_110 = uVar15 >> 0x38 | (uVar15 & 0xff000000000000) >> 0x28 |
              (uVar15 & 0xff0000000000) >> 0x18 | (uVar15 & 0xff00000000) >> 8 |
              (uVar15 & 0xff000000) << 8 | (uVar15 & 0xff0000) << 0x18 | (uVar15 & 0xff00) << 0x28 |
              uVar15 << 0x38;
  lVar9 = ((uVar10 ^ uVar4) & uVar11 ^ uVar4) + local_110 + uVar5 + -0x4a3f043013b2c4d1 +
          ((uVar11 * 0x800000 | uVar11 >> 0x29) ^
          (uVar11 << 0x2e | uVar11 >> 0x12) ^ (uVar11 << 0x32 | uVar11 >> 0xe));
  uVar8 = ((uVar14 ^ uVar13) & uVar1 ^ uVar14 & uVar13) +
          ((uVar14 * 0x2000000 | uVar14 >> 0x27) ^
          (uVar14 * 0x40000000 | uVar14 >> 0x22) ^ (uVar14 << 0x24 | uVar14 >> 0x1c)) + lVar9;
  uVar7 = lVar9 + uVar2;
  uVar15 = block[3];
  local_118 = uVar15 >> 0x38 | (uVar15 & 0xff000000000000) >> 0x28 |
              (uVar15 & 0xff0000000000) >> 0x18 | (uVar15 & 0xff00000000) >> 8 |
              (uVar15 & 0xff000000) << 8 | (uVar15 & 0xff0000) << 0x18 | (uVar15 & 0xff00) << 0x28 |
              uVar15 << 0x38;
  lVar9 = ((uVar11 ^ uVar10) & uVar7 ^ uVar10) + local_118 + uVar4 + -0x164a245a7e762444 +
          ((uVar7 * 0x800000 | uVar7 >> 0x29) ^
          (uVar7 << 0x2e | uVar7 >> 0x12) ^ (uVar7 << 0x32 | uVar7 >> 0xe));
  uVar16 = ((uVar8 ^ uVar14) & uVar13 ^ uVar8 & uVar14) +
           ((uVar8 * 0x2000000 | uVar8 >> 0x27) ^
           (uVar8 * 0x40000000 | uVar8 >> 0x22) ^ (uVar8 << 0x24 | uVar8 >> 0x1c)) + lVar9;
  uVar17 = lVar9 + uVar1;
  uVar15 = block[4];
  local_120 = uVar15 >> 0x38 | (uVar15 & 0xff000000000000) >> 0x28 |
              (uVar15 & 0xff0000000000) >> 0x18 | (uVar15 & 0xff00000000) >> 8 |
              (uVar15 & 0xff000000) << 8 | (uVar15 & 0xff0000) << 0x18 | (uVar15 & 0xff00) << 0x28 |
              uVar15 << 0x38;
  lVar9 = uVar10 + local_120 + ((uVar7 ^ uVar11) & uVar17 ^ uVar11) + 0x3956c25bf348b538 +
          ((uVar17 * 0x800000 | uVar17 >> 0x29) ^
          (uVar17 << 0x2e | uVar17 >> 0x12) ^ (uVar17 << 0x32 | uVar17 >> 0xe));
  uVar13 = uVar13 + lVar9;
  uVar10 = ((uVar16 ^ uVar8) & uVar14 ^ uVar16 & uVar8) +
           ((uVar16 * 0x2000000 | uVar16 >> 0x27) ^
           (uVar16 * 0x40000000 | uVar16 >> 0x22) ^ (uVar16 << 0x24 | uVar16 >> 0x1c)) + lVar9;
  uVar15 = block[5];
  local_128 = uVar15 >> 0x38 | (uVar15 & 0xff000000000000) >> 0x28 |
              (uVar15 & 0xff0000000000) >> 0x18 | (uVar15 & 0xff00000000) >> 8 |
              (uVar15 & 0xff000000) << 8 | (uVar15 & 0xff0000) << 0x18 | (uVar15 & 0xff00) << 0x28 |
              uVar15 << 0x38;
  lVar9 = uVar11 + local_128 + ((uVar17 ^ uVar7) & uVar13 ^ uVar7) + 0x59f111f1b605d019 +
          ((uVar13 * 0x800000 | uVar13 >> 0x29) ^
          (uVar13 << 0x2e | uVar13 >> 0x12) ^ (uVar13 << 0x32 | uVar13 >> 0xe));
  uVar14 = uVar14 + lVar9;
  uVar12 = ((uVar10 ^ uVar16) & uVar8 ^ uVar10 & uVar16) +
           ((uVar10 * 0x2000000 | uVar10 >> 0x27) ^
           (uVar10 * 0x40000000 | uVar10 >> 0x22) ^ (uVar10 << 0x24 | uVar10 >> 0x1c)) + lVar9;
  uVar15 = block[6];
  local_100 = uVar15 >> 0x38 | (uVar15 & 0xff000000000000) >> 0x28 |
              (uVar15 & 0xff0000000000) >> 0x18 | (uVar15 & 0xff00000000) >> 8 |
              (uVar15 & 0xff000000) << 8 | (uVar15 & 0xff0000) << 0x18 | (uVar15 & 0xff00) << 0x28 |
              uVar15 << 0x38;
  lVar9 = uVar7 + local_100 + ((uVar13 ^ uVar17) & uVar14 ^ uVar17) + -0x6dc07d5b50e6b065 +
          ((uVar14 * 0x800000 | uVar14 >> 0x29) ^
          (uVar14 << 0x2e | uVar14 >> 0x12) ^ (uVar14 << 0x32 | uVar14 >> 0xe));
  uVar8 = uVar8 + lVar9;
  uVar7 = ((uVar12 ^ uVar10) & uVar16 ^ uVar12 & uVar10) +
          ((uVar12 * 0x2000000 | uVar12 >> 0x27) ^
          (uVar12 * 0x40000000 | uVar12 >> 0x22) ^ (uVar12 << 0x24 | uVar12 >> 0x1c)) + lVar9;
  uVar15 = block[7];
  local_e8 = uVar15 >> 0x38 | (uVar15 & 0xff000000000000) >> 0x28 |
             (uVar15 & 0xff0000000000) >> 0x18 | (uVar15 & 0xff00000000) >> 8 |
             (uVar15 & 0xff000000) << 8 | (uVar15 & 0xff0000) << 0x18 | (uVar15 & 0xff00) << 0x28 |
             uVar15 << 0x38;
  lVar9 = uVar17 + local_e8 + ((uVar14 ^ uVar13) & uVar8 ^ uVar13) + -0x54e3a12a25927ee8 +
          ((uVar8 * 0x800000 | uVar8 >> 0x29) ^
          (uVar8 << 0x2e | uVar8 >> 0x12) ^ (uVar8 << 0x32 | uVar8 >> 0xe));
  uVar16 = uVar16 + lVar9;
  uVar17 = ((uVar7 ^ uVar12) & uVar10 ^ uVar7 & uVar12) +
           ((uVar7 * 0x2000000 | uVar7 >> 0x27) ^
           (uVar7 * 0x40000000 | uVar7 >> 0x22) ^ (uVar7 << 0x24 | uVar7 >> 0x1c)) + lVar9;
  uVar15 = block[8];
  local_140 = uVar15 >> 0x38 | (uVar15 & 0xff000000000000) >> 0x28 |
              (uVar15 & 0xff0000000000) >> 0x18 | (uVar15 & 0xff00000000) >> 8 |
              (uVar15 & 0xff000000) << 8 | (uVar15 & 0xff0000) << 0x18 | (uVar15 & 0xff00) << 0x28 |
              uVar15 << 0x38;
  lVar9 = uVar13 + local_140 + ((uVar8 ^ uVar14) & uVar16 ^ uVar14) + -0x27f855675cfcfdbe +
          ((uVar16 * 0x800000 | uVar16 >> 0x29) ^
          (uVar16 << 0x2e | uVar16 >> 0x12) ^ (uVar16 << 0x32 | uVar16 >> 0xe));
  uVar10 = uVar10 + lVar9;
  uVar18 = ((uVar17 ^ uVar7) & uVar12 ^ uVar17 & uVar7) +
           ((uVar17 * 0x2000000 | uVar17 >> 0x27) ^
           (uVar17 * 0x40000000 | uVar17 >> 0x22) ^ (uVar17 << 0x24 | uVar17 >> 0x1c)) + lVar9;
  uVar15 = block[9];
  local_168 = uVar15 >> 0x38 | (uVar15 & 0xff000000000000) >> 0x28 |
              (uVar15 & 0xff0000000000) >> 0x18 | (uVar15 & 0xff00000000) >> 8 |
              (uVar15 & 0xff000000) << 8 | (uVar15 & 0xff0000) << 0x18 | (uVar15 & 0xff00) << 0x28 |
              uVar15 << 0x38;
  lVar9 = uVar14 + local_168 + ((uVar16 ^ uVar8) & uVar10 ^ uVar8) + 0x12835b0145706fbe +
          ((uVar10 * 0x800000 | uVar10 >> 0x29) ^
          (uVar10 << 0x2e | uVar10 >> 0x12) ^ (uVar10 << 0x32 | uVar10 >> 0xe));
  uVar12 = uVar12 + lVar9;
  uVar20 = ((uVar18 ^ uVar17) & uVar7 ^ uVar18 & uVar17) +
           ((uVar18 * 0x2000000 | uVar18 >> 0x27) ^
           (uVar18 * 0x40000000 | uVar18 >> 0x22) ^ (uVar18 << 0x24 | uVar18 >> 0x1c)) + lVar9;
  uVar15 = block[10];
  local_130 = uVar15 >> 0x38 | (uVar15 & 0xff000000000000) >> 0x28 |
              (uVar15 & 0xff0000000000) >> 0x18 | (uVar15 & 0xff00000000) >> 8 |
              (uVar15 & 0xff000000) << 8 | (uVar15 & 0xff0000) << 0x18 | (uVar15 & 0xff00) << 0x28 |
              uVar15 << 0x38;
  lVar9 = uVar8 + local_130 + ((uVar10 ^ uVar16) & uVar12 ^ uVar16) + 0x243185be4ee4b28c +
          ((uVar12 * 0x800000 | uVar12 >> 0x29) ^
          (uVar12 << 0x2e | uVar12 >> 0x12) ^ (uVar12 << 0x32 | uVar12 >> 0xe));
  uVar7 = uVar7 + lVar9;
  uVar11 = ((uVar20 ^ uVar18) & uVar17 ^ uVar20 & uVar18) +
           ((uVar20 * 0x2000000 | uVar20 >> 0x27) ^
           (uVar20 * 0x40000000 | uVar20 >> 0x22) ^ (uVar20 << 0x24 | uVar20 >> 0x1c)) + lVar9;
  uVar15 = block[0xb];
  local_170 = uVar15 >> 0x38 | (uVar15 & 0xff000000000000) >> 0x28 |
              (uVar15 & 0xff0000000000) >> 0x18 | (uVar15 & 0xff00000000) >> 8 |
              (uVar15 & 0xff000000) << 8 | (uVar15 & 0xff0000) << 0x18 | (uVar15 & 0xff00) << 0x28 |
              uVar15 << 0x38;
  lVar9 = uVar16 + local_170 + ((uVar12 ^ uVar10) & uVar7 ^ uVar10) + 0x550c7dc3d5ffb4e2 +
          ((uVar7 * 0x800000 | uVar7 >> 0x29) ^
          (uVar7 << 0x2e | uVar7 >> 0x12) ^ (uVar7 << 0x32 | uVar7 >> 0xe));
  uVar17 = uVar17 + lVar9;
  uVar14 = ((uVar11 ^ uVar20) & uVar18 ^ uVar11 & uVar20) +
           ((uVar11 * 0x2000000 | uVar11 >> 0x27) ^
           (uVar11 * 0x40000000 | uVar11 >> 0x22) ^ (uVar11 << 0x24 | uVar11 >> 0x1c)) + lVar9;
  uVar15 = block[0xc];
  uVar13 = uVar15 >> 0x38 | (uVar15 & 0xff000000000000) >> 0x28 | (uVar15 & 0xff0000000000) >> 0x18
           | (uVar15 & 0xff00000000) >> 8 | (uVar15 & 0xff000000) << 8 | (uVar15 & 0xff0000) << 0x18
           | (uVar15 & 0xff00) << 0x28 | uVar15 << 0x38;
  lVar9 = uVar10 + uVar13 + ((uVar7 ^ uVar12) & uVar17 ^ uVar12) + 0x72be5d74f27b896f +
          ((uVar17 * 0x800000 | uVar17 >> 0x29) ^
          (uVar17 << 0x2e | uVar17 >> 0x12) ^ (uVar17 << 0x32 | uVar17 >> 0xe));
  uVar18 = uVar18 + lVar9;
  uVar10 = ((uVar14 ^ uVar11) & uVar20 ^ uVar14 & uVar11) +
           ((uVar14 * 0x2000000 | uVar14 >> 0x27) ^
           (uVar14 * 0x40000000 | uVar14 >> 0x22) ^ (uVar14 << 0x24 | uVar14 >> 0x1c)) + lVar9;
  uVar15 = block[0xd];
  local_160 = uVar15 >> 0x38 | (uVar15 & 0xff000000000000) >> 0x28 |
              (uVar15 & 0xff0000000000) >> 0x18 | (uVar15 & 0xff00000000) >> 8 |
              (uVar15 & 0xff000000) << 8 | (uVar15 & 0xff0000) << 0x18 | (uVar15 & 0xff00) << 0x28 |
              uVar15 << 0x38;
  lVar9 = uVar12 + local_160 + ((uVar17 ^ uVar7) & uVar18 ^ uVar7) + -0x7f214e01c4e9694f +
          ((uVar18 * 0x800000 | uVar18 >> 0x29) ^
          (uVar18 << 0x2e | uVar18 >> 0x12) ^ (uVar18 << 0x32 | uVar18 >> 0xe));
  uVar20 = uVar20 + lVar9;
  uVar12 = ((uVar10 ^ uVar14) & uVar11 ^ uVar10 & uVar14) +
           ((uVar10 * 0x2000000 | uVar10 >> 0x27) ^
           (uVar10 * 0x40000000 | uVar10 >> 0x22) ^ (uVar10 << 0x24 | uVar10 >> 0x1c)) + lVar9;
  uVar15 = block[0xe];
  uVar8 = uVar15 >> 0x38 | (uVar15 & 0xff000000000000) >> 0x28 | (uVar15 & 0xff0000000000) >> 0x18 |
          (uVar15 & 0xff00000000) >> 8 | (uVar15 & 0xff000000) << 8 | (uVar15 & 0xff0000) << 0x18 |
          (uVar15 & 0xff00) << 0x28 | uVar15 << 0x38;
  lVar9 = uVar7 + uVar8 + ((uVar18 ^ uVar17) & uVar20 ^ uVar17) + -0x6423f958da38edcb +
          ((uVar20 * 0x800000 | uVar20 >> 0x29) ^
          (uVar20 << 0x2e | uVar20 >> 0x12) ^ (uVar20 << 0x32 | uVar20 >> 0xe));
  uVar11 = uVar11 + lVar9;
  uVar7 = ((uVar12 ^ uVar10) & uVar14 ^ uVar12 & uVar10) +
          ((uVar12 * 0x2000000 | uVar12 >> 0x27) ^
          (uVar12 * 0x40000000 | uVar12 >> 0x22) ^ (uVar12 << 0x24 | uVar12 >> 0x1c)) + lVar9;
  uVar15 = block[0xf];
  local_158 = uVar15 >> 0x38 | (uVar15 & 0xff000000000000) >> 0x28 |
              (uVar15 & 0xff0000000000) >> 0x18 | (uVar15 & 0xff00000000) >> 8 |
              (uVar15 & 0xff000000) << 8 | (uVar15 & 0xff0000) << 0x18 | (uVar15 & 0xff00) << 0x28 |
              uVar15 << 0x38;
  lVar9 = uVar17 + local_158 + ((uVar20 ^ uVar18) & uVar11 ^ uVar18) + -0x3e640e8b3096d96c +
          ((uVar11 * 0x800000 | uVar11 >> 0x29) ^
          (uVar11 << 0x2e | uVar11 >> 0x12) ^ (uVar11 << 0x32 | uVar11 >> 0xe));
  uVar14 = uVar14 + lVar9;
  uVar15 = ((uVar7 ^ uVar12) & uVar10 ^ uVar7 & uVar12) +
           ((uVar7 * 0x2000000 | uVar7 >> 0x27) ^
           (uVar7 * 0x40000000 | uVar7 >> 0x22) ^ (uVar7 << 0x24 | uVar7 >> 0x1c)) + lVar9;
  for (lVar9 = 0x10; (uint)lVar9 < 0x50; lVar9 = lVar9 + 0x10) {
    local_138 = local_138 + local_168 +
                (local_108 >> 7 ^
                (local_108 << 0x38 | local_108 >> 8) ^
                (local_108 >> 1 | (ulong)((local_108 & 1) != 0) << 0x3f)) +
                (uVar8 >> 6 ^ (uVar8 << 3 | uVar8 >> 0x3d) ^ (uVar8 << 0x2d | uVar8 >> 0x13));
    lVar19 = uVar18 + ((uVar11 ^ uVar20) & uVar14 ^ uVar20) +
             ((uVar14 << 0x17 | uVar14 >> 0x29) ^
             (uVar14 << 0x2e | uVar14 >> 0x12) ^ (uVar14 << 0x32 | uVar14 >> 0xe)) + local_138 +
             rhash_k512[lVar9];
    uVar10 = uVar10 + lVar19;
    uVar16 = ((uVar15 ^ uVar7) & uVar12 ^ uVar15 & uVar7) +
             ((uVar15 << 0x19 | uVar15 >> 0x27) ^
             (uVar15 << 0x1e | uVar15 >> 0x22) ^ (uVar15 << 0x24 | uVar15 >> 0x1c)) + lVar19;
    local_108 = local_108 + local_130 +
                (local_110 >> 7 ^
                (local_110 << 0x38 | local_110 >> 8) ^
                (local_110 >> 1 | (ulong)((local_110 & 1) != 0) << 0x3f)) +
                (local_158 >> 6 ^
                (local_158 << 3 | local_158 >> 0x3d) ^ (local_158 << 0x2d | local_158 >> 0x13));
    lVar19 = uVar20 + local_108 + rhash_k512[lVar9 + 1] + ((uVar14 ^ uVar11) & uVar10 ^ uVar11) +
             ((uVar10 * 0x800000 | uVar10 >> 0x29) ^
             (uVar10 << 0x2e | uVar10 >> 0x12) ^ (uVar10 << 0x32 | uVar10 >> 0xe));
    uVar12 = uVar12 + lVar19;
    uVar20 = ((uVar16 ^ uVar15) & uVar7 ^ uVar16 & uVar15) +
             ((uVar16 * 0x2000000 | uVar16 >> 0x27) ^
             (uVar16 * 0x40000000 | uVar16 >> 0x22) ^ (uVar16 << 0x24 | uVar16 >> 0x1c)) + lVar19;
    local_110 = local_110 + local_170 +
                (local_118 >> 7 ^
                (local_118 << 0x38 | local_118 >> 8) ^
                (local_118 >> 1 | (ulong)((local_118 & 1) != 0) << 0x3f)) +
                (local_138 >> 6 ^
                (local_138 * 8 | local_138 >> 0x3d) ^ (local_138 << 0x2d | local_138 >> 0x13));
    lVar19 = uVar11 + local_110 + rhash_k512[lVar9 + 2] + ((uVar10 ^ uVar14) & uVar12 ^ uVar14) +
             ((uVar12 * 0x800000 | uVar12 >> 0x29) ^
             (uVar12 << 0x2e | uVar12 >> 0x12) ^ (uVar12 << 0x32 | uVar12 >> 0xe));
    uVar7 = uVar7 + lVar19;
    uVar11 = ((uVar20 ^ uVar16) & uVar15 ^ uVar20 & uVar16) +
             ((uVar20 * 0x2000000 | uVar20 >> 0x27) ^
             (uVar20 * 0x40000000 | uVar20 >> 0x22) ^ (uVar20 << 0x24 | uVar20 >> 0x1c)) + lVar19;
    local_118 = local_118 + uVar13 +
                (local_120 >> 7 ^
                (local_120 << 0x38 | local_120 >> 8) ^
                (local_120 >> 1 | (ulong)((local_120 & 1) != 0) << 0x3f)) +
                (local_108 >> 6 ^
                (local_108 * 8 | local_108 >> 0x3d) ^ (local_108 << 0x2d | local_108 >> 0x13));
    lVar19 = uVar14 + local_118 + rhash_k512[lVar9 + 3] + ((uVar12 ^ uVar10) & uVar7 ^ uVar10) +
             ((uVar7 * 0x800000 | uVar7 >> 0x29) ^
             (uVar7 << 0x2e | uVar7 >> 0x12) ^ (uVar7 << 0x32 | uVar7 >> 0xe));
    uVar15 = uVar15 + lVar19;
    uVar14 = ((uVar11 ^ uVar20) & uVar16 ^ uVar11 & uVar20) +
             ((uVar11 * 0x2000000 | uVar11 >> 0x27) ^
             (uVar11 * 0x40000000 | uVar11 >> 0x22) ^ (uVar11 << 0x24 | uVar11 >> 0x1c)) + lVar19;
    local_120 = local_120 + local_160 +
                (local_128 >> 7 ^
                (local_128 << 0x38 | local_128 >> 8) ^
                (local_128 >> 1 | (ulong)((local_128 & 1) != 0) << 0x3f)) +
                (local_110 >> 6 ^
                (local_110 * 8 | local_110 >> 0x3d) ^ (local_110 << 0x2d | local_110 >> 0x13));
    lVar19 = uVar10 + local_120 + rhash_k512[lVar9 + 4] + ((uVar7 ^ uVar12) & uVar15 ^ uVar12) +
             ((uVar15 * 0x800000 | uVar15 >> 0x29) ^
             (uVar15 << 0x2e | uVar15 >> 0x12) ^ (uVar15 << 0x32 | uVar15 >> 0xe));
    uVar16 = uVar16 + lVar19;
    uVar10 = ((uVar14 ^ uVar11) & uVar20 ^ uVar14 & uVar11) +
             ((uVar14 * 0x2000000 | uVar14 >> 0x27) ^
             (uVar14 * 0x40000000 | uVar14 >> 0x22) ^ (uVar14 << 0x24 | uVar14 >> 0x1c)) + lVar19;
    local_128 = local_128 + uVar8 +
                (local_100 >> 7 ^
                (local_100 << 0x38 | local_100 >> 8) ^
                (local_100 >> 1 | (ulong)((local_100 & 1) != 0) << 0x3f)) +
                (local_118 >> 6 ^
                (local_118 * 8 | local_118 >> 0x3d) ^ (local_118 << 0x2d | local_118 >> 0x13));
    lVar19 = rhash_k512[lVar9 + 5] + local_128 + uVar12 + ((uVar15 ^ uVar7) & uVar16 ^ uVar7) +
             ((uVar16 * 0x800000 | uVar16 >> 0x29) ^
             (uVar16 << 0x2e | uVar16 >> 0x12) ^ (uVar16 << 0x32 | uVar16 >> 0xe));
    uVar20 = uVar20 + lVar19;
    uVar17 = ((uVar10 ^ uVar14) & uVar11 ^ uVar10 & uVar14) +
             ((uVar10 * 0x2000000 | uVar10 >> 0x27) ^
             (uVar10 * 0x40000000 | uVar10 >> 0x22) ^ (uVar10 << 0x24 | uVar10 >> 0x1c)) + lVar19;
    local_100 = local_100 + local_158 +
                (local_e8 >> 7 ^
                (local_e8 << 0x38 | local_e8 >> 8) ^
                (local_e8 >> 1 | (ulong)((local_e8 & 1) != 0) << 0x3f)) +
                (local_120 >> 6 ^
                (local_120 * 8 | local_120 >> 0x3d) ^ (local_120 << 0x2d | local_120 >> 0x13));
    lVar19 = rhash_k512[lVar9 + 6] + local_100 + uVar7 + ((uVar16 ^ uVar15) & uVar20 ^ uVar15) +
             ((uVar20 * 0x800000 | uVar20 >> 0x29) ^
             (uVar20 << 0x2e | uVar20 >> 0x12) ^ (uVar20 << 0x32 | uVar20 >> 0xe));
    uVar11 = uVar11 + lVar19;
    uVar7 = ((uVar17 ^ uVar10) & uVar14 ^ uVar17 & uVar10) +
            ((uVar17 * 0x2000000 | uVar17 >> 0x27) ^
            (uVar17 * 0x40000000 | uVar17 >> 0x22) ^ (uVar17 << 0x24 | uVar17 >> 0x1c)) + lVar19;
    local_e8 = (local_140 >> 7 ^
               (local_140 << 0x38 | local_140 >> 8) ^
               (local_140 >> 1 | (ulong)((local_140 & 1) != 0) << 0x3f)) + local_e8 + local_138 +
               (local_128 >> 6 ^
               (local_128 * 8 | local_128 >> 0x3d) ^ (local_128 << 0x2d | local_128 >> 0x13));
    lVar19 = rhash_k512[lVar9 + 7] + local_e8 + uVar15 + ((uVar20 ^ uVar16) & uVar11 ^ uVar16) +
             ((uVar11 * 0x800000 | uVar11 >> 0x29) ^
             (uVar11 << 0x2e | uVar11 >> 0x12) ^ (uVar11 << 0x32 | uVar11 >> 0xe));
    uVar14 = uVar14 + lVar19;
    uVar15 = ((uVar7 ^ uVar17) & uVar10 ^ uVar7 & uVar17) +
             ((uVar7 * 0x2000000 | uVar7 >> 0x27) ^
             (uVar7 * 0x40000000 | uVar7 >> 0x22) ^ (uVar7 << 0x24 | uVar7 >> 0x1c)) + lVar19;
    local_140 = (local_168 >> 7 ^
                (local_168 << 0x38 | local_168 >> 8) ^
                (local_168 >> 1 | (ulong)((local_168 & 1) != 0) << 0x3f)) + local_140 + local_108 +
                (local_100 >> 6 ^
                (local_100 * 8 | local_100 >> 0x3d) ^ (local_100 << 0x2d | local_100 >> 0x13));
    lVar19 = rhash_k512[lVar9 + 8] + local_140 + uVar16 + ((uVar11 ^ uVar20) & uVar14 ^ uVar20) +
             ((uVar14 * 0x800000 | uVar14 >> 0x29) ^
             (uVar14 << 0x2e | uVar14 >> 0x12) ^ (uVar14 << 0x32 | uVar14 >> 0xe));
    uVar10 = uVar10 + lVar19;
    uVar18 = ((uVar15 ^ uVar7) & uVar17 ^ uVar15 & uVar7) +
             ((uVar15 * 0x2000000 | uVar15 >> 0x27) ^
             (uVar15 * 0x40000000 | uVar15 >> 0x22) ^ (uVar15 << 0x24 | uVar15 >> 0x1c)) + lVar19;
    local_168 = (local_130 >> 7 ^
                (local_130 << 0x38 | local_130 >> 8) ^
                (local_130 >> 1 | (ulong)((local_130 & 1) != 0) << 0x3f)) + local_168 + local_110 +
                (local_e8 >> 6 ^
                (local_e8 * 8 | local_e8 >> 0x3d) ^ (local_e8 << 0x2d | local_e8 >> 0x13));
    lVar19 = rhash_k512[lVar9 + 9] + local_168 + uVar20 + ((uVar14 ^ uVar11) & uVar10 ^ uVar11) +
             ((uVar10 * 0x800000 | uVar10 >> 0x29) ^
             (uVar10 << 0x2e | uVar10 >> 0x12) ^ (uVar10 << 0x32 | uVar10 >> 0xe));
    uVar17 = uVar17 + lVar19;
    uVar20 = ((uVar18 ^ uVar15) & uVar7 ^ uVar18 & uVar15) +
             ((uVar18 * 0x2000000 | uVar18 >> 0x27) ^
             (uVar18 * 0x40000000 | uVar18 >> 0x22) ^ (uVar18 << 0x24 | uVar18 >> 0x1c)) + lVar19;
    local_130 = (local_170 >> 7 ^
                (local_170 << 0x38 | local_170 >> 8) ^
                (local_170 >> 1 | (ulong)((local_170 & 1) != 0) << 0x3f)) + local_130 + local_118 +
                (local_140 >> 6 ^
                (local_140 * 8 | local_140 >> 0x3d) ^ (local_140 << 0x2d | local_140 >> 0x13));
    lVar19 = rhash_k512[lVar9 + 10] + local_130 + uVar11 + ((uVar10 ^ uVar14) & uVar17 ^ uVar14) +
             ((uVar17 * 0x800000 | uVar17 >> 0x29) ^
             (uVar17 << 0x2e | uVar17 >> 0x12) ^ (uVar17 << 0x32 | uVar17 >> 0xe));
    uVar7 = uVar7 + lVar19;
    uVar11 = ((uVar20 ^ uVar18) & uVar15 ^ uVar20 & uVar18) +
             ((uVar20 * 0x2000000 | uVar20 >> 0x27) ^
             (uVar20 * 0x40000000 | uVar20 >> 0x22) ^ (uVar20 << 0x24 | uVar20 >> 0x1c)) + lVar19;
    local_170 = (uVar13 >> 7 ^
                (uVar13 << 0x38 | uVar13 >> 8) ^ (uVar13 >> 1 | (ulong)((uVar13 & 1) != 0) << 0x3f))
                + local_170 + local_120 +
                (local_168 >> 6 ^
                (local_168 * 8 | local_168 >> 0x3d) ^ (local_168 << 0x2d | local_168 >> 0x13));
    lVar19 = rhash_k512[lVar9 + 0xb] + local_170 + uVar14 + ((uVar17 ^ uVar10) & uVar7 ^ uVar10) +
             ((uVar7 * 0x800000 | uVar7 >> 0x29) ^
             (uVar7 << 0x2e | uVar7 >> 0x12) ^ (uVar7 << 0x32 | uVar7 >> 0xe));
    uVar15 = uVar15 + lVar19;
    uVar14 = ((uVar11 ^ uVar20) & uVar18 ^ uVar11 & uVar20) +
             ((uVar11 * 0x2000000 | uVar11 >> 0x27) ^
             (uVar11 * 0x40000000 | uVar11 >> 0x22) ^ (uVar11 << 0x24 | uVar11 >> 0x1c)) + lVar19;
    uVar13 = (local_160 >> 7 ^
             (local_160 << 0x38 | local_160 >> 8) ^
             (local_160 >> 1 | (ulong)((local_160 & 1) != 0) << 0x3f)) + uVar13 + local_128 +
             (local_130 >> 6 ^
             (local_130 * 8 | local_130 >> 0x3d) ^ (local_130 << 0x2d | local_130 >> 0x13));
    lVar19 = rhash_k512[lVar9 + 0xc] + uVar13 + uVar10 + ((uVar7 ^ uVar17) & uVar15 ^ uVar17) +
             ((uVar15 * 0x800000 | uVar15 >> 0x29) ^
             (uVar15 << 0x2e | uVar15 >> 0x12) ^ (uVar15 << 0x32 | uVar15 >> 0xe));
    uVar18 = uVar18 + lVar19;
    uVar10 = ((uVar14 ^ uVar11) & uVar20 ^ uVar14 & uVar11) +
             ((uVar14 * 0x2000000 | uVar14 >> 0x27) ^
             (uVar14 * 0x40000000 | uVar14 >> 0x22) ^ (uVar14 << 0x24 | uVar14 >> 0x1c)) + lVar19;
    local_160 = (uVar8 >> 7 ^
                (uVar8 << 0x38 | uVar8 >> 8) ^ (uVar8 >> 1 | (ulong)((uVar8 & 1) != 0) << 0x3f)) +
                local_160 + local_100 +
                (local_170 >> 6 ^
                (local_170 * 8 | local_170 >> 0x3d) ^ (local_170 << 0x2d | local_170 >> 0x13));
    lVar19 = rhash_k512[lVar9 + 0xd] + local_160 + uVar17 + ((uVar15 ^ uVar7) & uVar18 ^ uVar7) +
             ((uVar18 * 0x800000 | uVar18 >> 0x29) ^
             (uVar18 << 0x2e | uVar18 >> 0x12) ^ (uVar18 << 0x32 | uVar18 >> 0xe));
    uVar20 = uVar20 + lVar19;
    uVar12 = ((uVar10 ^ uVar14) & uVar11 ^ uVar10 & uVar14) +
             ((uVar10 * 0x2000000 | uVar10 >> 0x27) ^
             (uVar10 * 0x40000000 | uVar10 >> 0x22) ^ (uVar10 << 0x24 | uVar10 >> 0x1c)) + lVar19;
    uVar8 = (local_158 >> 7 ^
            (local_158 << 0x38 | local_158 >> 8) ^
            (local_158 >> 1 | (ulong)((local_158 & 1) != 0) << 0x3f)) + uVar8 + local_e8 +
            (uVar13 >> 6 ^ (uVar13 * 8 | uVar13 >> 0x3d) ^ (uVar13 << 0x2d | uVar13 >> 0x13));
    lVar19 = rhash_k512[lVar9 + 0xe] + uVar8 + uVar7 + ((uVar18 ^ uVar15) & uVar20 ^ uVar15) +
             ((uVar20 * 0x800000 | uVar20 >> 0x29) ^
             (uVar20 << 0x2e | uVar20 >> 0x12) ^ (uVar20 << 0x32 | uVar20 >> 0xe));
    uVar11 = uVar11 + lVar19;
    uVar7 = ((uVar12 ^ uVar10) & uVar14 ^ uVar12 & uVar10) +
            ((uVar12 * 0x2000000 | uVar12 >> 0x27) ^
            (uVar12 * 0x40000000 | uVar12 >> 0x22) ^ (uVar12 << 0x24 | uVar12 >> 0x1c)) + lVar19;
    local_158 = (local_138 >> 7 ^
                (local_138 << 0x38 | local_138 >> 8) ^
                (local_138 >> 1 | (ulong)((local_138 & 1) != 0) << 0x3f)) + local_158 + local_140 +
                (local_160 >> 6 ^
                (local_160 * 8 | local_160 >> 0x3d) ^ (local_160 << 0x2d | local_160 >> 0x13));
    lVar19 = rhash_k512[lVar9 + 0xf] + local_158 + uVar15 + ((uVar20 ^ uVar18) & uVar11 ^ uVar18) +
             ((uVar11 * 0x800000 | uVar11 >> 0x29) ^
             (uVar11 << 0x2e | uVar11 >> 0x12) ^ (uVar11 << 0x32 | uVar11 >> 0xe));
    uVar14 = uVar14 + lVar19;
    uVar15 = ((uVar7 ^ uVar12) & uVar10 ^ uVar7 & uVar12) +
             ((uVar7 * 0x2000000 | uVar7 >> 0x27) ^
             (uVar7 * 0x40000000 | uVar7 >> 0x22) ^ (uVar7 << 0x24 | uVar7 >> 0x1c)) + lVar19;
  }
  *hash = uVar15 + uVar1;
  hash[1] = uVar7 + uVar2;
  hash[2] = uVar12 + uVar3;
  hash[3] = uVar10 + hash[3];
  hash[4] = uVar14 + uVar4;
  hash[5] = uVar11 + uVar5;
  hash[6] = uVar20 + uVar6;
  hash[7] = uVar18 + hash[7];
  return;
}

Assistant:

static void rhash_sha512_process_block(uint64_t hash[8], uint64_t block[16])
{
	uint64_t A, B, C, D, E, F, G, H;
	uint64_t W[16];
	const uint64_t* k;
	int i;

	A = hash[0], B = hash[1], C = hash[2], D = hash[3];
	E = hash[4], F = hash[5], G = hash[6], H = hash[7];

	/* Compute SHA using alternate Method: FIPS 180-3 6.1.3 */
	ROUND_1_16(A, B, C, D, E, F, G, H, 0);
	ROUND_1_16(H, A, B, C, D, E, F, G, 1);
	ROUND_1_16(G, H, A, B, C, D, E, F, 2);
	ROUND_1_16(F, G, H, A, B, C, D, E, 3);
	ROUND_1_16(E, F, G, H, A, B, C, D, 4);
	ROUND_1_16(D, E, F, G, H, A, B, C, 5);
	ROUND_1_16(C, D, E, F, G, H, A, B, 6);
	ROUND_1_16(B, C, D, E, F, G, H, A, 7);
	ROUND_1_16(A, B, C, D, E, F, G, H, 8);
	ROUND_1_16(H, A, B, C, D, E, F, G, 9);
	ROUND_1_16(G, H, A, B, C, D, E, F, 10);
	ROUND_1_16(F, G, H, A, B, C, D, E, 11);
	ROUND_1_16(E, F, G, H, A, B, C, D, 12);
	ROUND_1_16(D, E, F, G, H, A, B, C, 13);
	ROUND_1_16(C, D, E, F, G, H, A, B, 14);
	ROUND_1_16(B, C, D, E, F, G, H, A, 15);

	for (i = 16, k = &rhash_k512[16]; i < 80; i += 16, k += 16) {
		ROUND_17_80(A, B, C, D, E, F, G, H,  0);
		ROUND_17_80(H, A, B, C, D, E, F, G,  1);
		ROUND_17_80(G, H, A, B, C, D, E, F,  2);
		ROUND_17_80(F, G, H, A, B, C, D, E,  3);
		ROUND_17_80(E, F, G, H, A, B, C, D,  4);
		ROUND_17_80(D, E, F, G, H, A, B, C,  5);
		ROUND_17_80(C, D, E, F, G, H, A, B,  6);
		ROUND_17_80(B, C, D, E, F, G, H, A,  7);
		ROUND_17_80(A, B, C, D, E, F, G, H,  8);
		ROUND_17_80(H, A, B, C, D, E, F, G,  9);
		ROUND_17_80(G, H, A, B, C, D, E, F, 10);
		ROUND_17_80(F, G, H, A, B, C, D, E, 11);
		ROUND_17_80(E, F, G, H, A, B, C, D, 12);
		ROUND_17_80(D, E, F, G, H, A, B, C, 13);
		ROUND_17_80(C, D, E, F, G, H, A, B, 14);
		ROUND_17_80(B, C, D, E, F, G, H, A, 15);
	}

	hash[0] += A, hash[1] += B, hash[2] += C, hash[3] += D;
	hash[4] += E, hash[5] += F, hash[6] += G, hash[7] += H;
}